

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

int get_deepest_feature_layer(clip_ctx *ctx)

{
  int iVar1;
  int iVar2;
  __node_base *p_Var3;
  
  iVar1 = (ctx->vision_model).hparams.n_layer;
  if (((ctx->has_minicpmv_projector == false) && (ctx->has_glm_projector == false)) &&
     (ctx->has_qwen2vl_merger != true)) {
    iVar1 = iVar1 + -1;
  }
  p_Var3 = &(ctx->vision_model).hparams.vision_feature_layer._M_h._M_before_begin;
  iVar2 = -1;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    if (iVar2 < (int)*(size_type *)(p_Var3 + 1)) {
      iVar2 = (int)*(size_type *)(p_Var3 + 1);
    }
  }
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int get_deepest_feature_layer(const struct clip_ctx * ctx) {
    // Get the index of the second to last layer; this is the
    // default for models that have a llava projector
    const auto & hparams = ctx->vision_model.hparams;
    int n_layer = hparams.n_layer - 1;
    int deepest_feature_layer = -1;

    // Handle other projectors; incrementing here indicates that we
    // should use the last encoder layer for the vision features.
    if (ctx->has_minicpmv_projector || ctx->has_glm_projector || ctx->has_qwen2vl_merger) {
        n_layer += 1;
    }

    // If we set explicit vision feature layers, only go up to the deepest one
    for (const auto & feature_layer : hparams.vision_feature_layer) {
        if (feature_layer > deepest_feature_layer) {
            deepest_feature_layer = feature_layer;
        }
    }
    return deepest_feature_layer < 0 ? n_layer : deepest_feature_layer;
}